

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qAverageColor.cpp
# Opt level: O0

uint32_t AverageColorRGBA8(uint32_t *Pixels,size_t Count)

{
  uint *puVar1;
  uint32_t *CurColor;
  size_t i;
  uint64_t AlphaSum;
  uint64_t BlueSum;
  uint64_t GreenSum;
  uint64_t RedSum;
  size_t Count_local;
  uint32_t *Pixels_local;
  
  AlphaSum = 0;
  BlueSum = 0;
  GreenSum = 0;
  RedSum = 0;
  for (i = 0; i < Count; i = i + 1) {
    puVar1 = Pixels + i;
    AlphaSum = (*puVar1 >> 0x18) + AlphaSum;
    BlueSum = (*puVar1 >> 0x10 & 0xff) + BlueSum;
    GreenSum = (*puVar1 >> 8 & 0xff) + GreenSum;
    RedSum = (*puVar1 & 0xff) + RedSum;
  }
  return (int)(AlphaSum / Count) << 0x18 | ((uint)(BlueSum / Count) & 0xff) << 0x10 |
         ((uint)(GreenSum / Count) & 0xff) << 8 | (uint)(RedSum / Count) & 0xff;
}

Assistant:

std::uint32_t AverageColorRGBA8(
	const std::uint32_t Pixels[],
	std::size_t Count
)
{
	std::uint64_t RedSum, GreenSum, BlueSum, AlphaSum;
	RedSum = GreenSum = BlueSum = AlphaSum = 0;
	for( std::size_t i = 0; i < Count; ++i )
	{
		const std::uint32_t& CurColor = Pixels[i];
		AlphaSum += static_cast<std::uint8_t>( CurColor >> 24 );
		BlueSum  += static_cast<std::uint8_t>( CurColor >> 16 );
		GreenSum += static_cast<std::uint8_t>( CurColor >>  8 );
		RedSum   += static_cast<std::uint8_t>( CurColor >>  0 );
	}
	RedSum   /= Count;
	GreenSum /= Count;
	BlueSum  /= Count;
	AlphaSum /= Count;

	return
		(static_cast<std::uint32_t>( (std::uint8_t)AlphaSum ) << 24 ) |
		(static_cast<std::uint32_t>( (std::uint8_t) BlueSum ) << 16 ) |
		(static_cast<std::uint32_t>( (std::uint8_t)GreenSum ) <<  8 ) |
		(static_cast<std::uint32_t>( (std::uint8_t)  RedSum ) <<  0 );
}